

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp_json_serializer.cpp
# Opt level: O3

bool __thiscall dap::json::JsonCppDeserializer::deserialize(JsonCppDeserializer *this,object *v)

{
  bool bVar1;
  ArrayIndex AVar2;
  mapped_type *this_00;
  __hashtable *__this;
  double dVar3;
  const_iterator cVar4;
  JsonCppDeserializer d;
  undefined1 local_b8 [8];
  TypeInfo *pTStack_b0;
  void *local_a8;
  JsonCppDeserializer local_78;
  String local_60;
  ValueIteratorBase local_40;
  
  AVar2 = Json::Value::size(this->json);
  dVar3 = ceil((double)AVar2 / (double)(v->_M_h)._M_rehash_policy._M_max_load_factor);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dap::any>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dap::any>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::rehash(&v->_M_h,(long)(dVar3 - 9.223372036854776e+18) & (long)dVar3 >> 0x3f | (long)dVar3);
  cVar4 = Json::Value::begin(this->json);
  local_40.current_ = cVar4.super_ValueIteratorBase.current_._M_node;
  local_40.isNull_ = cVar4.super_ValueIteratorBase.isNull_;
  cVar4 = Json::Value::end(this->json);
  local_b8 = (undefined1  [8])cVar4.super_ValueIteratorBase.current_._M_node;
  pTStack_b0 = (TypeInfo *)CONCAT71(pTStack_b0._1_7_,cVar4.super_ValueIteratorBase.isNull_);
  bVar1 = Json::ValueIteratorBase::isEqual(&local_40,(SelfType *)local_b8);
  if (!bVar1) {
    do {
      local_78.json = Json::ValueIteratorBase::deref(&local_40);
      local_78.super_Deserializer._vptr_Deserializer =
           (_func_int **)&PTR__JsonCppDeserializer_00b386d8;
      local_78.ownsJson = false;
      local_b8 = (undefined1  [8])0x0;
      pTStack_b0 = (TypeInfo *)0x0;
      local_a8 = (void *)0x0;
      bVar1 = deserialize(&local_78,(any *)local_b8);
      if (!bVar1) {
        if (local_b8 != (undefined1  [8])0x0) {
          (*pTStack_b0->_vptr_TypeInfo[7])();
          if (local_b8 == (undefined1  [8])0x0) goto LAB_0085c8b5;
          if (local_a8 != (void *)0x0) {
            operator_delete__(local_a8);
          }
        }
        ~JsonCppDeserializer(&local_78);
        return false;
      }
      Json::ValueIteratorBase::name_abi_cxx11_(&local_60,&local_40);
      this_00 = std::__detail::
                _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dap::any>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dap::any>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dap::any>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dap::any>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)v,&local_60);
      any::operator=(this_00,(any *)local_b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
      if (local_b8 != (undefined1  [8])0x0) {
        (*pTStack_b0->_vptr_TypeInfo[7])();
        if (local_b8 == (undefined1  [8])0x0) {
LAB_0085c8b5:
          __assert_fail("value != nullptr",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmcppdap/include/dap/any.h"
                        ,0xc3,"void dap::any::free()");
        }
        if (local_a8 != (void *)0x0) {
          operator_delete__(local_a8);
        }
      }
      ~JsonCppDeserializer(&local_78);
      Json::ValueIteratorBase::increment(&local_40);
      cVar4 = Json::Value::end(this->json);
      local_b8 = (undefined1  [8])cVar4.super_ValueIteratorBase.current_._M_node;
      pTStack_b0 = (TypeInfo *)CONCAT71(pTStack_b0._1_7_,cVar4.super_ValueIteratorBase.isNull_);
      bVar1 = Json::ValueIteratorBase::isEqual(&local_40,(SelfType *)local_b8);
    } while (!bVar1);
  }
  return true;
}

Assistant:

bool JsonCppDeserializer::deserialize(dap::object* v) const {
  v->reserve(json->size());
  for (auto i = json->begin(); i != json->end(); i++) {
    JsonCppDeserializer d(&*i);
    dap::any val;
    if (!d.deserialize(&val)) {
      return false;
    }
    (*v)[i.name()] = val;
  }
  return true;
}